

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O2

ModelPtr createModelTwoComponentsWithOneVariableEach
                   (string *modelName,string *c1Name,string *c2Name,string *v1Name,string *v2Name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ModelPtr MVar1;
  VariablePtr v2;
  VariablePtr v1;
  ComponentPtr c2;
  ComponentPtr c1;
  allocator<char> local_91;
  string *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  string *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  string local_70 [32];
  ModelPtr local_50;
  ModelPtr local_40;
  
  libcellml::Model::create();
  libcellml::NamedEntity::setName((string *)(modelName->_M_dataplus)._M_p);
  createComponentInModel(&local_40,modelName);
  createComponentInModel(&local_50,modelName);
  libcellml::Variable::create();
  libcellml::NamedEntity::setName(local_80);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"public",(allocator<char> *)&local_90)
  ;
  libcellml::Variable::setInterfaceType(local_80);
  std::__cxx11::string::~string(local_70);
  libcellml::Component::addVariable
            ((shared_ptr *)
             local_40.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Variable::create();
  libcellml::NamedEntity::setName(local_90);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"public",&local_91);
  libcellml::Variable::setInterfaceType(local_90);
  std::__cxx11::string::~string(local_70);
  libcellml::Component::addVariable
            ((shared_ptr *)
             local_50.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  MVar1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)modelName;
  return (ModelPtr)MVar1.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ModelPtr createModelTwoComponentsWithOneVariableEach(const std::string &modelName, const std::string &c1Name, const std::string &c2Name, const std::string &v1Name, const std::string &v2Name)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName(modelName);
    auto c1 = createComponentInModel(model, c1Name);
    auto c2 = createComponentInModel(model, c2Name);

    libcellml::VariablePtr v1 = libcellml::Variable::create();
    v1->setName(v1Name);
    v1->setInterfaceType("public");
    c1->addVariable(v1);
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    v2->setName(v2Name);
    v2->setInterfaceType("public");
    c2->addVariable(v2);

    return model;
}